

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_lambda_t(basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,type2 *t)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  *this_00;
  type2 *t_local;
  basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::
  unique_ptr<std::function<std::__cxx11::string(std::__cxx11::string_const&)>,std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&)>>>
  ::
  unique_ptr<std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&)>>,void>
            ((unique_ptr<std::function<std::__cxx11::string(std::__cxx11::string_const&)>,std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&)>>>
              *)this);
  this_00 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
             *)operator_new(0x20);
  Catch::clara::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  ::function(this_00,t);
  std::
  unique_ptr<std::function<std::__cxx11::string(std::__cxx11::string_const&,kainjow::mustache::basic_renderer<std::__cxx11::string>const&)>,std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&,kainjow::mustache::basic_renderer<std::__cxx11::string>const&)>>>
  ::
  unique_ptr<std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&,kainjow::mustache::basic_renderer<std::__cxx11::string>const&)>>,void>
            ((unique_ptr<std::function<std::__cxx11::string(std::__cxx11::string_const&,kainjow::mustache::basic_renderer<std::__cxx11::string>const&)>,std::default_delete<std::function<std::__cxx11::string(std::__cxx11::string_const&,kainjow::mustache::basic_renderer<std::__cxx11::string>const&)>>>
              *)&this->type2_,this_00);
  return;
}

Assistant:

basic_lambda_t(const type2& t) : type2_(new type2(t)) {}